

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

void uv__threadpool_cleanup(void)

{
  int iVar1;
  uint local_c;
  uint i;
  
  if (nthreads != 0) {
    post(&exit_message,UV__WORK_CPU);
    for (local_c = 0; local_c < nthreads; local_c = local_c + 1) {
      iVar1 = uv_thread_join(threads + local_c);
      if (iVar1 != 0) {
        abort();
      }
    }
    if (threads != default_threads) {
      uv__free(threads);
    }
    uv_mutex_destroy(&mutex);
    uv_cond_destroy(&cond);
    threads = (uv_thread_t *)0x0;
    nthreads = 0;
  }
  return;
}

Assistant:

__attribute__((destructor))
#endif
void uv__threadpool_cleanup(void) {
  unsigned int i;

  if (nthreads == 0)
    return;

#ifndef __MVS__
  /* TODO(gabylb) - zos: revisit when Woz compiler is available. */
  post(&exit_message, UV__WORK_CPU);
#endif

  for (i = 0; i < nthreads; i++)
    if (uv_thread_join(threads + i))
      abort();

  if (threads != default_threads)
    uv__free(threads);

  uv_mutex_destroy(&mutex);
  uv_cond_destroy(&cond);

  threads = NULL;
  nthreads = 0;
}